

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

void Wln_NtkStaticFanoutTest(Wln_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int local_18;
  int iFanout;
  int iObj;
  int k;
  Wln_Ntk_t *p_local;
  
  uVar1 = Wln_NtkObjNum(p);
  printf("Printing fanouts of %d objects of network \"%s\":\n",(ulong)uVar1,p->pName);
  Wln_NtkStaticFanoutStart(p);
  for (local_18 = 1; iVar2 = Wln_NtkObjNum(p), local_18 < iVar2; local_18 = local_18 + 1) {
    Wln_ObjPrint(p,local_18);
    printf("   Fanouts : ");
    for (iFanout = 0; iVar2 = Wln_ObjRefs(p,local_18), iFanout < iVar2; iFanout = iFanout + 1) {
      uVar1 = Wln_ObjFanout(p,local_18,iFanout);
      printf("%5d ",(ulong)uVar1);
    }
    printf("\n");
  }
  Wln_NtkStaticFanoutStop(p);
  printf("\n");
  return;
}

Assistant:

void Wln_NtkStaticFanoutTest( Wln_Ntk_t * p )
{
    int k, iObj, iFanout;
    printf( "Printing fanouts of %d objects of network \"%s\":\n", Wln_NtkObjNum(p), p->pName );
    Wln_NtkStaticFanoutStart( p );
    Wln_NtkForEachObj( p, iObj )
    {
        Wln_ObjPrint( p, iObj );
        printf( "   Fanouts : " );
        Wln_ObjForEachFanoutStatic( p, iObj, iFanout, k )
            printf( "%5d ", iFanout );
        printf( "\n" );
    }
    Wln_NtkStaticFanoutStop( p );
    printf( "\n" );
}